

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * cinatra::base64_encode(string *str)

{
  long lVar1;
  size_type sVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_t in_len;
  char *bytes_to_encode;
  char char_array_4 [4];
  char char_array_3 [3];
  int j;
  int i;
  string *ret;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  size_type local_38;
  char *local_30;
  char local_1f [3];
  int local_1c;
  int local_18;
  undefined1 local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_stack_ffffffffffffffc0);
  local_18 = 0;
  local_1c = 0;
  local_30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x3e4c1e);
  local_38 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (local_10);
  while (sVar2 = local_38 - 1, local_38 != 0) {
    pcVar3 = local_30 + 1;
    lVar1 = (long)local_18;
    local_18 = local_18 + 1;
    local_1f[lVar1] = *local_30;
    local_38 = sVar2;
    local_30 = pcVar3;
    if (local_18 == 3) {
      for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                  (this,(size_type)in_RDI);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (this,(char)((ulong)in_RDI >> 0x38));
      }
      local_18 = 0;
    }
  }
  if (local_18 != 0) {
    for (local_1c = local_18; local_1c < 3; local_1c = local_1c + 1) {
      local_1f[local_1c] = '\0';
    }
    for (local_1c = 0; local_1c < local_18 + 1; local_1c = local_1c + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                (this,(size_type)in_RDI);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this,(char)((ulong)in_RDI >> 0x38));
    }
    while (local_18 < 3) {
      local_18 = local_18 + 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this,(char)((ulong)in_RDI >> 0x38));
    }
  }
  return this;
}

Assistant:

inline std::string base64_encode(const std::string &str) {
  std::string ret;
  int i = 0;
  int j = 0;
  char char_array_3[3];
  char char_array_4[4];

  auto bytes_to_encode = str.data();
  size_t in_len = str.size();
  while (in_len--) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] =
          ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] =
          ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for (i = 0; (i < 4); i++) ret += base64_chars[char_array_4[i]];
      i = 0;
    }
  }

  if (i) {
    for (j = i; j < 3; j++) char_array_3[j] = '\0';

    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] =
        ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] =
        ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;

    for (j = 0; (j < i + 1); j++) ret += base64_chars[char_array_4[j]];

    while ((i++ < 3)) ret += '=';
  }

  return ret;
}